

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O1

void ncnn::convdw3x3s2_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_requant,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  pointer pfVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  void *pvVar16;
  void *pvVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  void *local_80;
  
  iVar3 = top_blob->c;
  if (0 < (long)iVar3) {
    iVar4 = top_blob->w;
    iVar5 = top_blob->h;
    pvVar7 = _kernel->data;
    pvVar8 = _bias->data;
    iVar6 = bottom_blob->w;
    lVar12 = (long)((iVar6 - iVar4) * 2);
    lVar13 = 0;
    do {
      if (pvVar8 == (void *)0x0) {
        fVar21 = 0.0;
      }
      else {
        fVar21 = *(float *)((long)pvVar8 + lVar13 * 4);
      }
      if (0 < iVar5) {
        local_80 = (void *)(top_blob->cstep * lVar13 * top_blob->elemsize + (long)top_blob->data);
        pfVar9 = (scales_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        fVar1 = pfVar9[lVar13 * 2];
        fVar2 = pfVar9[lVar13 * 2 + 1];
        pvVar16 = (void *)(bottom_blob->cstep * lVar13 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        lVar10 = lVar13 * 9;
        pvVar17 = (void *)((long)pvVar16 + (long)iVar6 * 2);
        lVar18 = (long)pvVar16 + (long)iVar6;
        iVar14 = 0;
        do {
          if (0 < iVar4) {
            lVar19 = 0;
            lVar20 = 0;
            iVar15 = iVar4 + 1;
            do {
              fVar22 = roundf(((float)((int)*(char *)((long)pvVar7 + lVar10 + 8) *
                                       (int)*(char *)((long)pvVar17 + lVar19 * 2 + 2) +
                                       (int)*(char *)((long)pvVar7 + lVar10 + 7) *
                                       (int)*(char *)((long)pvVar17 + lVar19 * 2 + 1) +
                                      (int)*(char *)((long)pvVar7 + lVar10 + 6) *
                                      (int)*(char *)((long)pvVar17 + lVar19 * 2) +
                                      (int)*(char *)((long)pvVar7 + lVar10 + 5) *
                                      (int)*(char *)(lVar18 + 2 + lVar19 * 2) +
                                      (int)*(char *)((long)pvVar7 + lVar10 + 4) *
                                      (int)*(char *)(lVar18 + 1 + lVar19 * 2) +
                                      (int)*(char *)((long)pvVar7 + lVar10 + 3) *
                                      (int)*(char *)(lVar18 + lVar19 * 2) +
                                      (int)*(char *)((long)pvVar7 + lVar10 + 2) *
                                      (int)*(char *)((long)pvVar16 + lVar19 * 2 + 2) +
                                      (int)*(char *)((long)pvVar7 + lVar10 + 1) *
                                      (int)*(char *)((long)pvVar16 + lVar19 * 2 + 1) +
                                      (int)*(char *)((long)pvVar7 + lVar10) *
                                      (int)*(char *)((long)pvVar16 + lVar19 * 2)) * fVar1 + fVar21)
                              * fVar2);
              iVar11 = (int)fVar22;
              if (iVar11 < -0x7e) {
                iVar11 = -0x7f;
              }
              if (0x7e < iVar11) {
                iVar11 = 0x7f;
              }
              *(char *)((long)local_80 + lVar19) = (char)iVar11;
              iVar15 = iVar15 + -1;
              lVar20 = lVar20 + -2;
              lVar19 = lVar19 + 1;
            } while (1 < iVar15);
            pvVar17 = (void *)((long)pvVar17 - lVar20);
            lVar18 = lVar18 - lVar20;
            pvVar16 = (void *)((long)pvVar16 - lVar20);
            local_80 = (void *)((long)local_80 + lVar19);
          }
          pvVar16 = (void *)((long)pvVar16 + lVar12);
          lVar18 = lVar18 + lVar12;
          pvVar17 = (void *)((long)pvVar17 + lVar12);
          iVar14 = iVar14 + 1;
        } while (iVar14 != iVar5);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != iVar3);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_requant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        signed char *outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_requant_in = scales_requant[2*p];      
        const float scale_requant_out = scales_requant[2*p+1]; 

        const signed char *kernel0 = (const signed char *)kernel + p * 9;

        const signed char *img0 = bottom_blob.channel(p);
        const signed char *r0 = img0;
        const signed char *r1 = img0 + w;
        const signed char *r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr = float2int8(((float)sum * scale_requant_in + bias0) * scale_requant_out);

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}